

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O2

void vkt::synchronization::anon_unknown_0::initSubmitInfo
               (VkSubmitInfo *submitInfo,deUint32 submitInfoCount)

{
  undefined8 *puVar1;
  long lVar2;
  
  for (lVar2 = 0; (ulong)submitInfoCount * 0x48 - lVar2 != 0; lVar2 = lVar2 + 0x48) {
    *(undefined4 *)((long)&submitInfo->sType + lVar2) = 4;
    *(undefined8 *)((long)&submitInfo->pNext + lVar2) = 0;
    *(undefined4 *)((long)&submitInfo->waitSemaphoreCount + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&submitInfo->pWaitSemaphores + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&submitInfo->commandBufferCount + lVar2) = 1;
    *(undefined4 *)((long)&submitInfo->signalSemaphoreCount + lVar2) = 0;
    *(undefined8 *)((long)&submitInfo->pSignalSemaphores + lVar2) = 0;
  }
  return;
}

Assistant:

static void initSubmitInfo (VkSubmitInfo* submitInfo, deUint32 submitInfoCount)
{
	for (deUint32 ndx = 0; ndx < submitInfoCount; ndx++)
	{
		submitInfo[ndx].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
		submitInfo[ndx].pNext					= DE_NULL;
		submitInfo[ndx].waitSemaphoreCount		= 0;
		submitInfo[ndx].pWaitSemaphores			= DE_NULL;
		submitInfo[ndx].pWaitDstStageMask		= DE_NULL;
		submitInfo[ndx].commandBufferCount		= 1;
		submitInfo[ndx].signalSemaphoreCount	= 0;
		submitInfo[ndx].pSignalSemaphores		= DE_NULL;
	}
}